

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O3

int sparse_list_add(pax *pax,int64_t offset,int64_t length)

{
  sparse_block_conflict *psVar1;
  int iVar2;
  int64_t offset_00;
  
  psVar1 = pax->sparse_tail;
  if (psVar1 == (sparse_block_conflict *)0x0) {
    offset_00 = 0;
  }
  else {
    offset_00 = psVar1->remaining + psVar1->offset;
  }
  if (offset - offset_00 != 0 && offset_00 <= offset) {
    iVar2 = _sparse_list_add_block(pax,offset_00,offset - offset_00,1);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  iVar2 = _sparse_list_add_block(pax,offset,length,0);
  return iVar2;
}

Assistant:

static int
sparse_list_add(struct pax *pax, int64_t offset, int64_t length)
{
	int64_t last_offset;
	int r;

	if (pax->sparse_tail == NULL)
		last_offset = 0;
	else {
		last_offset = pax->sparse_tail->offset +
		    pax->sparse_tail->remaining;
	}
	if (last_offset < offset) {
		/* Add a hole block. */
		r = _sparse_list_add_block(pax, last_offset,
		    offset - last_offset, 1);
		if (r != ARCHIVE_OK)
			return (r);
	}
	/* Add data block. */
	return (_sparse_list_add_block(pax, offset, length, 0));
}